

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderLayeredRenderingBoundaryConditionNoGS::
GeometryShaderLayeredRenderingBoundaryConditionNoGS
          (GeometryShaderLayeredRenderingBoundaryConditionNoGS *this,Context *context,
          ExtParameters *extParams,char *name,char *description)

{
  value_type local_28;
  
  GeometryShaderLayeredRenderingBoundaryCondition::GeometryShaderLayeredRenderingBoundaryCondition
            (&this->super_GeometryShaderLayeredRenderingBoundaryCondition,context,extParams,name,
             description);
  (this->super_GeometryShaderLayeredRenderingBoundaryCondition).super_TestCaseBase.super_TestCase.
  super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryShaderLayeredRenderingBoundaryCondition_01dffc78;
  local_28.m_depth = 4;
  local_28.m_draw_buffer = 0x8ce0;
  local_28.m_id = 0;
  local_28.m_texture_target = 0x806f;
  std::
  vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
  ::push_back(&(this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_textures_info,
              &local_28);
  (this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_draw_mode = 6;
  (this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_n_points = 4;
  (this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_is_fbo_layered = true;
  return;
}

Assistant:

GeometryShaderLayeredRenderingBoundaryConditionNoGS::GeometryShaderLayeredRenderingBoundaryConditionNoGS(
	Context& context, const ExtParameters& extParams, const char* name, const char* description)
	: GeometryShaderLayeredRenderingBoundaryCondition(context, extParams, name, description)
{
	TextureInfo texInfo;

	texInfo.m_depth			 = 4;
	texInfo.m_draw_buffer	= GL_COLOR_ATTACHMENT0;
	texInfo.m_id			 = 0;
	texInfo.m_texture_target = GL_TEXTURE_3D;

	m_textures_info.push_back(texInfo);

	m_draw_mode		 = GL_TRIANGLE_FAN;
	m_n_points		 = 4;
	m_is_fbo_layered = true;
}